

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O1

void sensors_analytics::utils::ObjectNode::ValueNode::ToStr(ValueNode *node,string *buffer)

{
  switch(node->node_type_) {
  case NUMBER:
    DumpNumber((node->value_).number_value,buffer);
    return;
  case INT:
    DumpNumber((node->value_).int_value,buffer);
    return;
  case STRING:
    DumpString(&node->string_data_,buffer);
    return;
  case LIST:
    DumpList(&node->list_data_,buffer);
    return;
  case DATETIME:
    DumpDateTime(&(node->value_).int_value,(node->value_).date_time_value.milliseconds,buffer);
    return;
  case BOOL:
    std::__cxx11::string::append((char *)buffer);
    return;
  case OBJECT:
    DumpNode(&node->object_data_,buffer);
    return;
  default:
    return;
  }
}

Assistant:

void
utils::ObjectNode::ValueNode::ToStr(const utils::ObjectNode::ValueNode &node,
                                    string *buffer) {
  switch (node.node_type_) {
    case NUMBER:
      DumpNumber(node.value_.number_value, buffer);
      break;
    case INT:
      DumpNumber(node.value_.int_value, buffer);
      break;
    case STRING:
      DumpString(node.string_data_, buffer);
      break;
    case LIST:
      DumpList(node.list_data_, buffer);
      break;
    case BOOL:
      *buffer += (node.value_.bool_value ? "true" : "false");
      break;
    case OBJECT:
      DumpNode(node.object_data_, buffer);
      break;
    case DATETIME:
      DumpDateTime(node.value_.date_time_value.seconds,
                   node.value_.date_time_value.milliseconds, buffer);
      break;
    default:
      break;
  }
}